

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int bc_get_leb128(BCReaderState *s,uint32_t *pval)

{
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  byte bVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  
  pbVar1 = s->ptr;
  if (pbVar1 < s->buf_end) {
    bVar4 = 0;
    uVar6 = 0;
    uVar7 = 0;
    pbVar2 = pbVar1;
    do {
      pbVar5 = pbVar2 + 1;
      uVar7 = (*pbVar2 & 0x7f) << (bVar4 & 0x1f) | uVar7;
      if (-1 < (char)*pbVar2) {
        *pval = uVar7;
        uVar6 = uVar6 + 1;
        goto LAB_0013e5e6;
      }
      bVar8 = uVar6 < 4;
      uVar6 = uVar6 + 1;
      bVar4 = bVar4 + 7;
      pbVar2 = pbVar5;
    } while (pbVar5 < s->buf_end && bVar8);
  }
  *pval = 0;
  uVar6 = 0xffffffff;
LAB_0013e5e6:
  if ((int)uVar6 < 0) {
    bc_get_leb128_cold_1();
    iVar3 = -1;
  }
  else {
    s->ptr = pbVar1 + uVar6;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int bc_get_leb128(BCReaderState *s, uint32_t *pval)
{
    int ret;
    ret = get_leb128(pval, s->ptr, s->buf_end);
    if (unlikely(ret < 0))
        return bc_read_error_end(s);
    s->ptr += ret;
    return 0;
}